

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void pixels::compareExact(float af,float bf,int x,int y,char *taga,char *tagb,char *chan)

{
  size_t sVar1;
  ostream *poVar2;
  uint uVar3;
  char *func;
  
  if (af != bf) {
    if (chan == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3655d8);
    }
    else {
      sVar1 = strlen(chan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,chan,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," float at ",10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," not equal: ",0xc);
    if (taga == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar1 = strlen(taga);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,taga,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," 0x",3);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = std::ostream::_M_insert<double>((double)af);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") vs ",5);
    if (tagb == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar1 = strlen(tagb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,tagb,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    uVar3 = *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    func = (char *)(ulong)uVar3;
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) = uVar3;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = std::ostream::_M_insert<double>((double)bf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (af != bf) {
      core_test_fail("a.iv == b.iv",(char *)0x215,0x185ace,func);
    }
  }
  return;
}

Assistant:

static inline void compareExact (
        float       af,
        float       bf,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        union
        {
            uint32_t iv;
            float    fv;
        } a, b;
        a.fv = af;
        b.fv = bf;
        if (a.iv != b.iv)
        {
            std::cout << chan << " float at " << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a.iv
                      << std::dec << " (" << af << ") vs " << tagb << " "
                      << std::hex << b.iv << std::dec << " (" << bf << ")"
                      << std::endl;
        }
        EXRCORE_TEST (a.iv == b.iv);
    }